

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O0

sexp_conflict
sexp_get_terminal_attributes_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res1;
  sexp_conflict res;
  termios *tmp1;
  int err;
  int local_78;
  int local_70;
  int local_68;
  int local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  termios *local_38;
  int local_2c;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_2c = 0;
  local_48 = 0x43e;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_58,0,0x10);
  if ((((((ulong)local_28 & 3) == 0) && (*local_28 == 0x10)) ||
      ((((ulong)local_28 & 3) == 0 && (*local_28 == 0x11)))) ||
     (((((ulong)local_28 & 3) == 0 && (*local_28 == 0x12)) || (((ulong)local_28 & 1) == 1)))) {
    local_58 = &local_48;
    local_50 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_58;
    local_38 = (termios *)calloc(1,0x3d);
    if (((((ulong)local_28 & 3) == 0) && (*local_28 == 0x10)) ||
       ((((ulong)local_28 & 3) == 0 && (*local_28 == 0x11)))) {
      if (*(long *)(local_28 + 8) == 0) {
        if (((*(ulong *)(local_28 + 6) & 3) == 0) && (**(int **)(local_28 + 6) == 0x12)) {
          local_68 = (int)*(undefined8 *)(*(long *)(local_28 + 6) + 0x10);
        }
        else {
          local_68 = -1;
        }
        local_60 = local_68;
      }
      else {
        local_60 = fileno(*(FILE **)(local_28 + 8));
      }
      local_70 = local_60;
    }
    else {
      if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0x12)) {
        local_78 = (int)*(undefined8 *)(local_28 + 4);
      }
      else {
        auVar1._8_8_ = (long)local_28 >> 0x3f;
        auVar1._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
        local_78 = SUB164(auVar1 / SEXT816(2),0);
      }
      local_70 = local_78;
    }
    local_2c = tcgetattr(local_70,local_38);
    if (local_2c == 0) {
      auVar2._8_8_ = (long)*(ulong *)(local_18 + 0x38) >> 0x3f;
      auVar2._0_8_ = *(ulong *)(local_18 + 0x38) & 0xfffffffffffffffe;
      local_40 = (sexp_conflict)
                 sexp_make_cpointer(local_10,SUB168(auVar2 / SEXT816(2),0),local_38,0x3e,1);
    }
    else {
      local_40 = (sexp_conflict)0x3e;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_50;
    local_8 = local_40;
  }
  else {
    local_8 = (sexp_conflict)
              sexp_xtype_exception(local_10,local_18,"not a port or file descriptor",local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_get_terminal_attributes_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  struct termios* tmp1;
  sexp res;
  sexp_gc_var1(res1);
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  sexp_gc_preserve1(ctx, res1);
  tmp1 = (struct termios*) calloc(1, 1 + sizeof(tmp1[0]));
  err = tcgetattr((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), tmp1);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, SEXP_FALSE, 1);
  res = res1;
  }
  sexp_gc_release1(ctx);
  return res;
}